

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_subscribe_notifications(cubeb_conflict *context,pa_subscription_mask_t mask)

{
  pa_operation *stream;
  pa_subscription_mask_t in_ESI;
  void *in_RDI;
  pa_operation *o;
  pa_operation *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
  (*cubeb_pa_context_set_subscribe_callback)
            (*(pa_context **)((long)in_RDI + 0x18),pulse_subscribe_callback,in_RDI);
  stream = (*cubeb_pa_context_subscribe)
                     (*(pa_context **)((long)in_RDI + 0x18),in_ESI,subscribe_success,in_RDI);
  if (stream == (pa_operation *)0x0) {
    (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
       (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
      (*g_cubeb_log_callback)("%s:%d: Context subscribe failed\n","cubeb_pulse.c",0x668);
    }
    local_4 = -1;
  }
  else {
    operation_wait((cubeb_conflict *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(pa_stream *)stream,
                   in_stack_ffffffffffffffd8);
    (*cubeb_pa_operation_unref)(stream);
    (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
pulse_subscribe_notifications(cubeb * context, pa_subscription_mask_t mask)
{
  WRAP(pa_threaded_mainloop_lock)(context->mainloop);

  WRAP(pa_context_set_subscribe_callback)
  (context->context, pulse_subscribe_callback, context);

  pa_operation * o;
  o = WRAP(pa_context_subscribe)(context->context, mask, subscribe_success,
                                 context);
  if (o == NULL) {
    WRAP(pa_threaded_mainloop_unlock)(context->mainloop);
    LOG("Context subscribe failed");
    return CUBEB_ERROR;
  }
  operation_wait(context, NULL, o);
  WRAP(pa_operation_unref)(o);

  WRAP(pa_threaded_mainloop_unlock)(context->mainloop);

  return CUBEB_OK;
}